

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackGenerator.cxx
# Opt level: O2

string * __thiscall
cmCPackGenerator::GetComponentPackageFileName
          (string *__return_storage_ptr__,cmCPackGenerator *this,string *initialPackageFileName,
          string *groupOrComponentName,bool isGroupName)

{
  bool bVar1;
  cmValue cVar2;
  string groupDispVar;
  string suffix;
  string dispNameVar;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  string local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  std::operator+(&local_68,"-",groupOrComponentName);
  std::operator+(&local_a8,"CPACK_",&this->Name);
  std::operator+(&local_48,&local_a8,"_USE_DISPLAY_NAME_IN_FILENAME");
  std::__cxx11::string::~string((string *)&local_a8);
  bVar1 = IsOn(this,&local_48);
  if (!bVar1) goto LAB_0015be8b;
  if (isGroupName) {
    cmsys::SystemTools::UpperCase(&local_88,groupOrComponentName);
    std::operator+(&bStack_c8,"CPACK_COMPONENT_GROUP_",&local_88);
    std::operator+(&local_a8,&bStack_c8,"_DISPLAY_NAME");
    std::__cxx11::string::~string((string *)&bStack_c8);
    std::__cxx11::string::~string((string *)&local_88);
    cVar2 = GetOption(this,&local_a8);
    if (cVar2.Value != (string *)0x0) {
      std::operator+(&bStack_c8,"-",cVar2.Value);
LAB_0015be69:
      std::__cxx11::string::operator=((string *)&local_68,(string *)&bStack_c8);
      std::__cxx11::string::~string((string *)&bStack_c8);
    }
  }
  else {
    cmsys::SystemTools::UpperCase(&local_88,groupOrComponentName);
    std::operator+(&bStack_c8,"CPACK_COMPONENT_",&local_88);
    std::operator+(&local_a8,&bStack_c8,"_DISPLAY_NAME");
    std::__cxx11::string::~string((string *)&bStack_c8);
    std::__cxx11::string::~string((string *)&local_88);
    cVar2 = GetOption(this,&local_a8);
    if (cVar2.Value != (string *)0x0) {
      std::operator+(&bStack_c8,"-",cVar2.Value);
      goto LAB_0015be69;
    }
  }
  std::__cxx11::string::~string((string *)&local_a8);
LAB_0015be8b:
  std::operator+(__return_storage_ptr__,initialPackageFileName,&local_68);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  return __return_storage_ptr__;
}

Assistant:

std::string cmCPackGenerator::GetComponentPackageFileName(
  const std::string& initialPackageFileName,
  const std::string& groupOrComponentName, bool isGroupName)
{

  /*
   * the default behavior is to use the
   * component [group] name as a suffix
   */
  std::string suffix = "-" + groupOrComponentName;
  /* check if we should use DISPLAY name */
  std::string dispNameVar =
    "CPACK_" + this->Name + "_USE_DISPLAY_NAME_IN_FILENAME";
  if (this->IsOn(dispNameVar)) {
    /* the component Group case */
    if (isGroupName) {
      std::string groupDispVar = "CPACK_COMPONENT_GROUP_" +
        cmSystemTools::UpperCase(groupOrComponentName) + "_DISPLAY_NAME";
      cmValue groupDispName = this->GetOption(groupDispVar);
      if (groupDispName) {
        suffix = "-" + *groupDispName;
      }
    }
    /* the [single] component case */
    else {
      std::string dispVar = "CPACK_COMPONENT_" +
        cmSystemTools::UpperCase(groupOrComponentName) + "_DISPLAY_NAME";
      cmValue dispName = this->GetOption(dispVar);
      if (dispName) {
        suffix = "-" + *dispName;
      }
    }
  }
  return initialPackageFileName + suffix;
}